

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ptls_openssl_init_sign_certificate(ptls_openssl_sign_certificate_t *self,EVP_PKEY *key)

{
  bool bVar1;
  int iVar2;
  EVP_MD *pEVar3;
  ec_key_st *key_00;
  EC_GROUP *group;
  
  (self->super).cb = sign_certificate;
  self->key = (EVP_PKEY *)0x0;
  *(undefined8 *)self->schemes = 0;
  self->schemes[0].scheme_md = (EVP_MD *)0x0;
  *(undefined8 *)(self->schemes + 1) = 0;
  self->schemes[1].scheme_md = (EVP_MD *)0x0;
  *(undefined8 *)(self->schemes + 2) = 0;
  self->schemes[2].scheme_md = (EVP_MD *)0x0;
  *(undefined8 *)(self->schemes + 3) = 0;
  self->schemes[3].scheme_md = (EVP_MD *)0x0;
  iVar2 = EVP_PKEY_get_id(key);
  if (iVar2 != 0x198) {
    if (iVar2 != 6) {
      return 0x204;
    }
    pEVar3 = EVP_sha256();
    self->schemes[0].scheme_id = 0x804;
    self->schemes[0].scheme_md = (EVP_MD *)pEVar3;
    pEVar3 = EVP_sha384();
    self->schemes[1].scheme_id = 0x805;
    self->schemes[1].scheme_md = (EVP_MD *)pEVar3;
    pEVar3 = EVP_sha512();
    self->schemes[2].scheme_id = 0x806;
    self->schemes[2].scheme_md = (EVP_MD *)pEVar3;
    iVar2 = 3;
    goto LAB_001084d8;
  }
  key_00 = EVP_PKEY_get1_EC_KEY((EVP_PKEY *)key);
  group = EC_KEY_get0_group(key_00);
  iVar2 = EC_GROUP_get_curve_name(group);
  if (iVar2 == 0x2cc) {
    pEVar3 = EVP_sha512();
    self->schemes[0].scheme_id = 0x603;
LAB_001084b6:
    self->schemes[0].scheme_md = (EVP_MD *)pEVar3;
    bVar1 = true;
    iVar2 = 1;
  }
  else {
    if (iVar2 == 0x2cb) {
      pEVar3 = EVP_sha384();
      self->schemes[0].scheme_id = 0x503;
      goto LAB_001084b6;
    }
    if (iVar2 == 0x19f) {
      pEVar3 = EVP_sha256();
      self->schemes[0].scheme_id = 0x403;
      goto LAB_001084b6;
    }
    iVar2 = 0;
    bVar1 = false;
  }
  EC_KEY_free(key_00);
  if (!bVar1) {
    return 0x204;
  }
LAB_001084d8:
  *(undefined2 *)((long)&self->schemes[0].scheme_id + (ulong)(uint)(iVar2 << 4)) = 0xffff;
  *(undefined8 *)((long)&self->schemes[0].scheme_md + (ulong)(uint)(iVar2 << 4)) = 0;
  EVP_PKEY_up_ref(key);
  self->key = key;
  return 0;
}

Assistant:

int ptls_openssl_init_sign_certificate(ptls_openssl_sign_certificate_t *self, EVP_PKEY *key)
{
    *self = (ptls_openssl_sign_certificate_t){{sign_certificate}};
    size_t scheme_index = 0;

#define PUSH_SCHEME(id, md)                                                                                                        \
    self->schemes[scheme_index++] = (struct st_ptls_openssl_signature_scheme_t)                                                    \
    {                                                                                                                              \
        id, md                                                                                                                     \
    }

    switch (EVP_PKEY_id(key)) {
    case EVP_PKEY_RSA:
        PUSH_SCHEME(PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256, EVP_sha256());
        PUSH_SCHEME(PTLS_SIGNATURE_RSA_PSS_RSAE_SHA384, EVP_sha384());
        PUSH_SCHEME(PTLS_SIGNATURE_RSA_PSS_RSAE_SHA512, EVP_sha512());
        break;
    case EVP_PKEY_EC: {
        EC_KEY *eckey = EVP_PKEY_get1_EC_KEY(key);
        switch (EC_GROUP_get_curve_name(EC_KEY_get0_group(eckey))) {
        case NID_X9_62_prime256v1:
            PUSH_SCHEME(PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256, EVP_sha256());
            break;
#if defined(NID_secp384r1) && !OPENSSL_NO_SHA384
        case NID_secp384r1:
            PUSH_SCHEME(PTLS_SIGNATURE_ECDSA_SECP384R1_SHA384, EVP_sha384());
            break;
#endif
#if defined(NID_secp384r1) && !OPENSSL_NO_SHA512
        case NID_secp521r1:
            PUSH_SCHEME(PTLS_SIGNATURE_ECDSA_SECP521R1_SHA512, EVP_sha512());
            break;
#endif
        default:
            EC_KEY_free(eckey);
            return PTLS_ERROR_INCOMPATIBLE_KEY;
        }
        EC_KEY_free(eckey);
    } break;
    default:
        return PTLS_ERROR_INCOMPATIBLE_KEY;
    }
    PUSH_SCHEME(UINT16_MAX, NULL);
    assert(scheme_index <= PTLS_ELEMENTSOF(self->schemes));

#undef PUSH_SCHEME

    EVP_PKEY_up_ref(key);
    self->key = key;

    return 0;
}